

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void writeSol(char *fout,cupdlp_int nCols,cupdlp_int nRows,cupdlp_float *col_value,
             cupdlp_float *col_dual,cupdlp_float *row_value,cupdlp_float *row_dual)

{
  uint uVar1;
  FILE *__stream;
  undefined4 in_register_00000014;
  ulong uVar2;
  ulong uVar3;
  
  puts("--------------------------------");
  uVar2 = 0;
  printf("--- saving sol to %s\n",fout);
  puts("--------------------------------");
  __stream = fopen(fout,"w");
  fputc(0x7b,__stream);
  fputc(10,__stream);
  fprintf(__stream,"\"nCols\": %d",(ulong)(uint)nCols);
  fwrite(",\n",2,1,__stream);
  fprintf(__stream,"\"nRows\": %d",CONCAT44(in_register_00000014,nRows));
  fwrite(",\n",2,1,__stream);
  fwrite("\"col_value\": [",0xe,1,__stream);
  if (nCols != 0 && col_value != (cupdlp_float *)0x0) {
    uVar1 = nCols - 1;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      fprintf(__stream,"%.14f,",col_value[uVar2]);
    }
    fprintf(__stream,"%.14f",col_value[(int)uVar1]);
  }
  fputc(0x5d,__stream);
  fwrite(",\n",2,1,__stream);
  fwrite("\"col_dual\": [",0xd,1,__stream);
  if (col_dual != (cupdlp_float *)0x0 && nCols != 0) {
    uVar1 = nCols - 1;
    uVar2 = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      fprintf(__stream,"%.14f,",col_dual[uVar2]);
    }
    fprintf(__stream,"%.14f",col_dual[(int)uVar1]);
  }
  fputc(0x5d,__stream);
  fwrite(",\n",2,1,__stream);
  fwrite("\"row_value\": [",0xe,1,__stream);
  if (nRows != 0 && row_value != (cupdlp_float *)0x0) {
    uVar1 = nRows - 1;
    uVar2 = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      fprintf(__stream,"%.14f,",row_value[uVar2]);
    }
    fprintf(__stream,"%.14f",row_value[(int)uVar1]);
  }
  fputc(0x5d,__stream);
  fwrite(",\n",2,1,__stream);
  fwrite("\"row_dual\": [",0xd,1,__stream);
  if (row_dual != (cupdlp_float *)0x0 && nRows != 0) {
    uVar1 = nRows - 1;
    uVar3 = 0;
    uVar2 = 0;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      fprintf(__stream,"%.14f,",row_dual[uVar3]);
    }
    fprintf(__stream,"%.14f",row_dual[(int)uVar1]);
  }
  fputc(0x5d,__stream);
  fputc(10,__stream);
  fputc(0x7d,__stream);
  fclose(__stream);
  return;
}

Assistant:

void writeSol(const char *fout, cupdlp_int nCols, cupdlp_int nRows,
              cupdlp_float *col_value, cupdlp_float *col_dual,
              cupdlp_float *row_value, cupdlp_float *row_dual) {
  FILE *fptr;

  cupdlp_printf("--------------------------------\n");
  cupdlp_printf("--- saving sol to %s\n", fout);
  cupdlp_printf("--------------------------------\n");
  // Open a file in writing mode
  fptr = fopen(fout, "w");
  fprintf(fptr, "{");

  // nCols
  fprintf(fptr, "\n");

  fprintf(fptr, "\"nCols\": %d", nCols);

  // nRows
  fprintf(fptr, ",\n");

  fprintf(fptr, "\"nRows\": %d", nRows);

  // col value
  fprintf(fptr, ",\n");

  fprintf(fptr, "\"col_value\": [");
  if (col_value && nCols) {
    for (int i = 0; i < nCols - 1; ++i) {
      fprintf(fptr, "%.14f,", col_value[i]);
    }
    fprintf(fptr, "%.14f", col_value[nCols - 1]);
  }
  fprintf(fptr, "]");

  // col dual
  fprintf(fptr, ",\n");
  fprintf(fptr, "\"col_dual\": [");
  if (col_dual && nCols) {
    for (int i = 0; i < nCols - 1; ++i) {
      fprintf(fptr, "%.14f,", col_dual[i]);
    }
    fprintf(fptr, "%.14f", col_dual[nCols - 1]);
  }
  fprintf(fptr, "]");

  // row value
  fprintf(fptr, ",\n");
  fprintf(fptr, "\"row_value\": [");
  if (row_value && nRows) {
    for (int i = 0; i < nRows - 1; ++i) {
      fprintf(fptr, "%.14f,", row_value[i]);
    }
    fprintf(fptr, "%.14f", row_value[nRows - 1]);
  }
  fprintf(fptr, "]");

  // row dual
  fprintf(fptr, ",\n");
  fprintf(fptr, "\"row_dual\": [");
  if (row_dual && nRows) {
    for (int i = 0; i < nRows - 1; ++i) {
      fprintf(fptr, "%.14f,", row_dual[i]);
    }
    fprintf(fptr, "%.14f", row_dual[nRows - 1]);
  }
  fprintf(fptr, "]");

  // end writing
  fprintf(fptr, "\n");
  fprintf(fptr, "}");

  // Close the file
  fclose(fptr);
}